

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::remove_maximal_cell
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
           *this,ID_index cellID)

{
  anon_class_16_2_ef03d0af __comp;
  uint uVar1;
  const_iterator this_00;
  bool bVar2;
  pointer pvVar3;
  mapped_type *pmVar4;
  Pos_index *pPVar5;
  size_type __n;
  reference __k;
  iterator __first;
  iterator __last;
  reference puVar6;
  iterator iStack_b8;
  Index i;
  iterator __end0_1;
  iterator __begin0_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3_1;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  Dictionary *__range3;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> colToSwap;
  Index startIndex;
  Pos_index startPos;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  const_iterator it;
  Dictionary *pivotToPosition;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
  *pCStack_10;
  ID_index cellID_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
  *this_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
       &(this->super_Chain_vine_swap_option).super_type.pivotToPosition_;
  pivotToPosition._4_4_ = cellID;
  pCStack_10 = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                 _M_cur,(key_type *)((long)&pivotToPosition + 4));
  _startIndex = (__node_type *)
                std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::end(it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur);
  bVar2 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
                     &startIndex);
  if (!bVar2) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                         *)&local_28);
    colToSwap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = pvVar3->second;
    pmVar4 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::at(&this->pivotToColumnIndex_,(key_type *)((long)&pivotToPosition + 4));
    uVar1 = colToSwap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    colToSwap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = *pmVar4;
    pPVar5 = _nextPosition(this);
    if (uVar1 != *pPVar5 - 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      __n = std::
            unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>_>
            ::size(&this->matrix_);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,__n);
      this_00 = it;
      __end0 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::begin((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)it.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur);
      p = (value_type *)
          std::
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)this_00.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                   _M_cur);
      while (bVar2 = std::__detail::operator!=
                               (&__end0.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  *)&p), bVar2) {
        __k = std::__detail::
              _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
              operator*(&__end0);
        if (colToSwap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < __k->second) {
          pmVar4 = std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::at(&this->pivotToColumnIndex_,&__k->first);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,pmVar4);
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator++
                  (&__end0);
      }
      __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      __comp.this = this;
      __comp.pivotToPosition =
           (Dictionary *)
           it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>::remove_maximal_cell(unsigned_int)::_lambda(unsigned_int,unsigned_int)_1_>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__last._M_current,__comp);
      __end0_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      iStack_b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      while (bVar2 = __gnu_cxx::operator!=(&__end0_1,&stack0xffffffffffffff48), bVar2) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end0_1);
        colToSwap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
             ::vine_swap(&this->super_Chain_vine_swap_option,
                         (Index)colToSwap.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,*puVar6);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end0_1);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    }
    _remove_last(this,(Index)colToSwap.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::remove_maximal_cell(ID_index cellID)
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'remove_maximal_cell' is not implemented for the chosen options.");
  static_assert(Master_matrix::Option_list::has_map_column_container &&
                    Master_matrix::Option_list::has_vine_update &&
                    Master_matrix::Option_list::has_column_pairings,
                "'remove_maximal_cell' is not implemented for the chosen options.");

  // TODO: find simple test to verify that col at columnIndex is maximal even without row access.

  const auto& pivotToPosition = Swap_opt::CP::pivotToPosition_;
  auto it = pivotToPosition.find(cellID);
  if (it == pivotToPosition.end()) return;  // cell does not exists. TODO: put an assert instead?
  Pos_index startPos = it->second;
  Index startIndex = pivotToColumnIndex_.at(cellID);

  if (startPos != _nextPosition() - 1) {
    std::vector<Index> colToSwap;
    colToSwap.reserve(matrix_.size());

    for (auto& p : pivotToPosition) {
      if (p.second > startPos) colToSwap.push_back(pivotToColumnIndex_.at(p.first));
    }
    std::sort(colToSwap.begin(), colToSwap.end(), [&](Index c1, Index c2) {
      return pivotToPosition.at(get_pivot(c1)) < pivotToPosition.at(get_pivot(c2));
    });

    for (Index i : colToSwap) {
      startIndex = Swap_opt::vine_swap(startIndex, i);
    }
  }

  _remove_last(startIndex);
}